

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  secp256k1_fe tmp;
  secp256k1_fe sqrt;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe local_40;
  
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  tmp.n[4] = x->n[4];
  tmp.magnitude = x->magnitude;
  tmp.normalized = x->normalized;
  secp256k1_fe_verify(x);
  sqrt.n[0] = x->n[0];
  sqrt.n[1] = x->n[1];
  sqrt.n[2] = x->n[2];
  sqrt.n[3] = x->n[3];
  sqrt.n[4] = x->n[4];
  sqrt.magnitude = x->magnitude;
  sqrt.normalized = x->normalized;
  secp256k1_fe_normalize_var(&sqrt);
  iVar1 = secp256k1_fe_is_zero(&sqrt);
  if (iVar1 == 0) {
    secp256k1_fe_to_signed62(&s,&sqrt);
    uVar2 = secp256k1_jacobi64_maybe_var(&s,&secp256k1_const_modinfo_fe);
    if (uVar2 == 0) {
      uVar2 = secp256k1_fe_sqrt(&local_40,&sqrt);
    }
    else {
      uVar2 = ~uVar2 >> 0x1f;
    }
  }
  else {
    uVar2 = 1;
  }
  secp256k1_fe_normalize_weak(&tmp);
  uVar3 = secp256k1_fe_sqrt(&sqrt,&tmp);
  if (uVar2 == uVar3) {
    return uVar2;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
          ,0x194,"test condition failed: ret == secp256k1_fe_sqrt(&sqrt, &tmp)");
  abort();
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    secp256k1_fe_verify(x);
    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}